

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::format_decimal<signed_char>(char **buffer,char value)

{
  char cVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  uint n;
  undefined7 in_register_00000031;
  
  n = (uint)CONCAT71(in_register_00000031,value);
  if (value < '\0') {
    pcVar2 = *buffer;
    *buffer = pcVar2 + 1;
    *pcVar2 = '-';
    n = -n;
  }
  if (n < 100) {
    if (n < 10) {
      pbVar3 = (byte *)*buffer;
      *buffer = (char *)(pbVar3 + 1);
      *pbVar3 = (byte)n | 0x30;
    }
    else {
      cVar1 = internal::basic_data<void>::DIGITS[(ulong)n * 2];
      pcVar2 = *buffer;
      *buffer = pcVar2 + 1;
      *pcVar2 = cVar1;
      cVar1 = internal::basic_data<void>::DIGITS[(ulong)(n * 2) + 1];
      pcVar2 = *buffer;
      *buffer = pcVar2 + 1;
      *pcVar2 = cVar1;
    }
  }
  else {
    iVar4 = internal::count_digits(n);
    internal::format_decimal<char,unsigned_int,char*,fmt::v5::internal::no_thousands_sep>
              (*buffer,n,iVar4);
    *buffer = *buffer + iVar4;
  }
  return;
}

Assistant:

inline void format_decimal(char *&buffer, T value) {
  typedef typename internal::int_traits<T>::main_type main_type;
  main_type abs_value = static_cast<main_type>(value);
  if (internal::is_negative(value)) {
    *buffer++ = '-';
    abs_value = 0 - abs_value;
  }
  if (abs_value < 100) {
    if (abs_value < 10) {
      *buffer++ = static_cast<char>('0' + abs_value);
      return;
    }
    unsigned index = static_cast<unsigned>(abs_value * 2);
    *buffer++ = internal::data::DIGITS[index];
    *buffer++ = internal::data::DIGITS[index + 1];
    return;
  }
  int num_digits = internal::count_digits(abs_value);
  internal::format_decimal<char>(
        internal::make_checked(buffer, internal::to_unsigned(num_digits)), abs_value, num_digits);
  buffer += num_digits;
}